

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UriParse.c
# Opt level: O1

wchar_t * uriParseOwnHost2W(UriParserStateW *state,wchar_t *first,wchar_t *afterLast,
                           UriMemoryManager *memory)

{
  UriUriW *pUVar1;
  wchar_t wVar2;
  UriBool UVar3;
  UriIp4 *octetOutput;
  wchar_t *pwVar4;
  
  while (first < afterLast) {
    switch(*first) {
    case L'!':
    case L'$':
    case L'%':
    case L'&':
    case L'\'':
    case L'(':
    case L')':
    case L'*':
    case L'+':
    case L',':
    case L'-':
    case L'.':
    case L'0':
    case L'1':
    case L'2':
    case L'3':
    case L'4':
    case L'5':
    case L'6':
    case L'7':
    case L'8':
    case L'9':
    case L';':
    case L'=':
    case L'A':
    case L'B':
    case L'C':
    case L'D':
    case L'E':
    case L'F':
    case L'G':
    case L'H':
    case L'I':
    case L'J':
    case L'K':
    case L'L':
    case L'M':
    case L'N':
    case L'O':
    case L'P':
    case L'Q':
    case L'R':
    case L'S':
    case L'T':
    case L'U':
    case L'V':
    case L'W':
    case L'X':
    case L'Y':
    case L'Z':
    case L'_':
    case L'a':
    case L'b':
    case L'c':
    case L'd':
    case L'e':
    case L'f':
    case L'g':
    case L'h':
    case L'i':
    case L'j':
    case L'k':
    case L'l':
    case L'm':
    case L'n':
    case L'o':
    case L'p':
    case L'q':
    case L'r':
    case L's':
    case L't':
    case L'u':
    case L'v':
    case L'w':
    case L'x':
    case L'y':
    case L'z':
    case L'~':
      first = uriParsePctSubUnresW(state,first,afterLast,memory);
      if (first == (wchar_t *)0x0) {
        return (wchar_t *)0x0;
      }
      break;
    default:
      UVar3 = uriOnExitOwnHost2W(state,first,memory);
      if (UVar3 != 0) {
        pwVar4 = uriParseAuthorityTwoW(state,first,afterLast);
        return pwVar4;
      }
      goto LAB_001b6a79;
    }
  }
  (state->uri->hostText).afterLast = first;
  octetOutput = (UriIp4 *)(*memory->malloc)(memory,4);
  pUVar1 = state->uri;
  (pUVar1->hostData).ip4 = octetOutput;
  if (octetOutput != (UriIp4 *)0x0) {
    wVar2 = uriParseIpFourAddressW
                      ((uchar *)octetOutput,(pUVar1->hostText).first,(pUVar1->hostText).afterLast);
    if (wVar2 != L'\0') {
      (*memory->free)(memory,(state->uri->hostData).ip4);
      (state->uri->hostData).ip4 = (UriIp4 *)0x0;
    }
    if (octetOutput != (UriIp4 *)0x0) {
      return afterLast;
    }
  }
LAB_001b6a79:
  uriFreeUriMembersMmW(state->uri,memory);
  state->errorPos = (wchar_t *)0x0;
  state->errorCode = L'\x03';
  return (wchar_t *)0x0;
}

Assistant:

static const URI_CHAR * URI_FUNC(ParseOwnHost2)(
		URI_TYPE(ParserState) * state, const URI_CHAR * first,
		const URI_CHAR * afterLast, UriMemoryManager * memory) {
	if (first >= afterLast) {
		if (!URI_FUNC(OnExitOwnHost2)(state, first, memory)) {
			URI_FUNC(StopMalloc)(state, memory);
			return NULL;
		}
		return afterLast;
	}

	switch (*first) {
	case _UT('!'):
	case _UT('$'):
	case _UT('%'):
	case _UT('&'):
	case _UT('('):
	case _UT(')'):
	case _UT('-'):
	case _UT('*'):
	case _UT(','):
	case _UT('.'):
	case _UT(';'):
	case _UT('\''):
	case _UT('_'):
	case _UT('~'):
	case _UT('+'):
	case _UT('='):
	case URI_SET_DIGIT:
	case URI_SET_ALPHA:
		{
			const URI_CHAR * const afterPctSubUnres
					= URI_FUNC(ParsePctSubUnres)(state, first, afterLast, memory);
			if (afterPctSubUnres == NULL) {
				return NULL;
			}
			return URI_FUNC(ParseOwnHost2)(state, afterPctSubUnres, afterLast, memory);
		}

	default:
		if (!URI_FUNC(OnExitOwnHost2)(state, first, memory)) {
			URI_FUNC(StopMalloc)(state, memory);
			return NULL;
		}
		return URI_FUNC(ParseAuthorityTwo)(state, first, afterLast);
	}
}